

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O2

int njoy::tools::disco::Integer<3u>::
    read<int,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *param_2)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  runtime_error *this;
  char *first;
  from_chars_result_t<char> fVar4;
  uint position;
  int value;
  
  pcVar2 = iter->_M_current;
  position = 0;
  value = 0;
  BaseFixedWidthField<3u>::
  skipSpaces<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter,&position);
  bVar3 = isNewLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter);
  if (bVar3) {
    return value;
  }
  first = iter->_M_current;
  if (position == 3 || *first == -1) {
    return value;
  }
  if (*first == '+') {
    first = first + 1;
    iter->_M_current = first;
    position = position + 1;
    if (position == 3) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"cannot parse invalid integer number 1");
      goto LAB_0013725f;
    }
  }
  fVar4 = fast_float::from_chars<int,char,int>(first,pcVar2 + 3,&value,10);
  if (fVar4.ec == 0) {
    iVar1 = *(int *)&iter->_M_current;
    iter->_M_current = fVar4.ptr;
    position = position + ((int)fVar4.ptr - iVar1);
    BaseFixedWidthField<3u>::
    skipSpaces<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter,&position);
    if (position == 3) {
      return value;
    }
    bVar3 = isNewLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter);
    if (bVar3) {
      return value;
    }
    if (*iter->_M_current == -1) {
      return value;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"cannot parse invalid integer number 3");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"cannot parse invalid integer number 2");
  }
LAB_0013725f:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Representation read( Iterator& iter, const Iterator& ) {

    unsigned int position = 0;
    const auto end = iter + Width;
    Representation value = 0;

    skipSpaces( iter, position );
    if ( isNewLine( iter ) || isEndOfFile( iter ) || Width == position ) {

      return value;
    }

    skipPlusSign( iter, position );
    if ( Width == position ) {

      throw std::runtime_error( "cannot parse invalid integer number 1" );
    }

    // we are using fast_float::from_chars instead of std::from_chars since
    // not all standard c++ libraries implement the floating point version of
    // std::from_chars
    auto result = fast_float::from_chars( &*iter, &*end, value );
    if ( result.ec == std::errc() ) {

      auto advance = result.ptr - &*iter;
      iter += advance;
      position += advance;
    }
    else {

      throw std::runtime_error( "cannot parse invalid integer number 2" );
    }

    skipSpaces( iter, position );
    if ( Width != position ) {

      if ( ! isNewLine( iter ) && ! isEndOfFile( iter ) ) {

        throw std::runtime_error( "cannot parse invalid integer number 3" );
      }
    }

    return value;
  }